

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCB.cpp
# Opt level: O2

void print_pcbs(list<PCB_*,_std::allocator<PCB_*>_> *p)

{
  int *piVar1;
  ostream *poVar2;
  list<PCB_*,_std::allocator<PCB_*>_> *plVar3;
  string s;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  plVar3 = p;
  while (plVar3 = *(list<PCB_*,_std::allocator<PCB_*>_> **)plVar3, plVar3 != p) {
    piVar1 = *(int **)(plVar3 + 0x10);
    poVar2 = std::operator<<((ostream *)&std::cout,"ID\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*piVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Job Size:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,piVar1[1]);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"JobPri:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,piVar1[2]);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"InSize:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,piVar1[3]);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"OutSize:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,piVar1[4]);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"TempSize:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,piVar1[5]);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Total Size:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,piVar1[6]);
    std::endl<char,std::char_traits<char>>(poVar2);
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    if ((uint)piVar1[7] < 5) {
      std::__cxx11::string::assign((char *)&local_50);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"State:\t");
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (*(list<PCB_*,_std::allocator<PCB_*>_> **)p == p) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No PCBs to print.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void print_pcbs(std::list<PCB *> p)
{

    for(PCB *pcb : p)
    {
        std::cout << "ID\t" << pcb->job_id << std::endl;
        std::cout << "Job Size:\t" << pcb->job_size << std::endl;
        std::cout << "JobPri:\t" << pcb->job_pri << std::endl;
        std::cout << "InSize:\t" << pcb->in_buf_size << std::endl;
        std::cout << "OutSize:\t" << pcb->out_buf_size << std::endl;
        std::cout << "TempSize:\t" << pcb->temp_buf_size << std::endl;
        std::cout << "Total Size:\t" << pcb->total_size << std::endl;
        std::string s;
        switch((int)pcb->state)
        {
            case 0: {
                s = "RUNNING";
                break;
            }
            case 1: {
                s = "READY";
                break;
            }
            case 2: {
                s = "BLOCKED";
                break;
            }
            case 3: {
                s = "NEW";
                break;
            }
            case 4: {
                s = "COMPLETED";
                break;
            }
        }
        std::cout << "State:\t" << s << std::endl;
        std::cout << std::endl;
    }

    if (p.empty())
        std::cout << ("No PCBs to print.") << std::endl;

}